

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_defer_clear_tasks_for_queue(fio_task_queue_s *queue)

{
  fio_defer_task_s *pfVar1;
  undefined1 local_ff8 [4064];
  undefined1 *local_18;
  fio_defer_queue_block_s *tmp;
  fio_task_queue_s *queue_local;
  
  tmp = (fio_defer_queue_block_s *)queue;
  fio_lock(&queue->lock);
  while (tmp->tasks[0].arg1 != (void *)0x0) {
    local_18 = (undefined1 *)tmp->tasks[0].arg1;
    tmp->tasks[0].arg1 = *(void **)((long)tmp->tasks[0].arg1 + 0xfc0);
    if ((fio_defer_task_s *)local_18 != tmp->tasks + 1) {
      free(local_18);
    }
  }
  pfVar1 = tmp->tasks;
  memset(local_ff8,0,0xfe0);
  memcpy(pfVar1 + 1,local_ff8,0xfe0);
  tmp->tasks[0].arg2 = tmp->tasks + 1;
  tmp->tasks[0].arg1 = tmp->tasks + 1;
  fio_unlock((fio_lock_i *)tmp);
  return;
}

Assistant:

static inline void fio_defer_clear_tasks_for_queue(fio_task_queue_s *queue) {
  fio_lock(&queue->lock);
  while (queue->reader) {
    fio_defer_queue_block_s *tmp = queue->reader;
    queue->reader = queue->reader->next;
    if (tmp != &queue->static_queue) {
      COUNT_DEALLOC;
      free(tmp);
    }
  }
  queue->static_queue = (fio_defer_queue_block_s){.next = NULL};
  queue->reader = queue->writer = &queue->static_queue;
  fio_unlock(&queue->lock);
}